

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall
Json::StyledStreamWriter::writeCommentBeforeValue(StyledStreamWriter *this,Value *root)

{
  _Alloc_hider _Var1;
  char local_41;
  string local_40;
  
  if ((root->comments_ != (CommentInfo *)0x0) && (root->comments_->comment_ != (char *)0x0)) {
    if ((this->field_0x68 & 2) == 0) {
      writeIndent(this);
    }
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    if (local_40._M_string_length != 0) {
      _Var1._M_p = local_40._M_dataplus._M_p;
      do {
        local_41 = *_Var1._M_p;
        std::__ostream_insert<char,std::char_traits<char>>(this->document_,&local_41,1);
        if (((*_Var1._M_p == '\n') &&
            (_Var1._M_p != local_40._M_dataplus._M_p + local_40._M_string_length)) &&
           (_Var1._M_p[1] == '/')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->document_,(this->indentString_)._M_dataplus._M_p,
                     (this->indentString_)._M_string_length);
        }
        _Var1._M_p = _Var1._M_p + 1;
      } while (_Var1._M_p != local_40._M_dataplus._M_p + local_40._M_string_length);
    }
    this->field_0x68 = this->field_0x68 & 0xfd;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

bool Value::hasComment(CommentPlacement placement) const {
  return comments_ != 0 && comments_[placement].comment_ != 0;
}